

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O0

bool __thiscall Test::Suite::run(Suite *this,Output *out,bool continueOnError)

{
  int iVar1;
  vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> local_38;
  byte local_19;
  Output *pOStack_18;
  bool continueOnError_local;
  Output *out_local;
  Suite *this_local;
  
  local_19 = continueOnError;
  pOStack_18 = out;
  out_local = (Output *)this;
  (*this->_vptr_Suite[4])();
  iVar1 = (*this->_vptr_Suite[3])(this,out,&local_38,(ulong)(local_19 & 1));
  std::vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>::~vector(&local_38);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool Suite::run(Output &out, bool continueOnError) { return run(out, listTests(), continueOnError); }